

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule.c
# Opt level: O1

void Rule_delete(Rule *rule)

{
  Scenario *scenario;
  ChildDefinitions *pCVar1;
  long lVar2;
  
  if (rule != (Rule *)0x0) {
    if (rule->id != (wchar_t *)0x0) {
      free(rule->id);
    }
    if (rule->keyword != (wchar_t *)0x0) {
      free(rule->keyword);
    }
    if (rule->name != (wchar_t *)0x0) {
      free(rule->name);
    }
    if (rule->description != (wchar_t *)0x0) {
      free(rule->description);
    }
    if (rule->tags != (Tags *)0x0) {
      Tags_delete(rule->tags);
    }
    if (rule->child_definitions != (ChildDefinitions *)0x0) {
      if (L'\0' < rule->child_definitions->child_definition_count) {
        pCVar1 = rule->child_definitions;
        if (L'\0' < pCVar1->child_definition_count) {
          lVar2 = 0;
          do {
            scenario = (Scenario *)pCVar1->child_definitions[lVar2];
            if (scenario->type == Gherkin_Scenario) {
              Scenario_delete(scenario);
            }
            else if (scenario->type == Gherkin_Background) {
              Background_delete((Background *)scenario);
            }
            lVar2 = lVar2 + 1;
            pCVar1 = rule->child_definitions;
          } while (lVar2 < pCVar1->child_definition_count);
        }
        free(pCVar1->child_definitions);
      }
      free(rule->child_definitions);
    }
    free(rule);
    return;
  }
  return;
}

Assistant:

void Rule_delete(const Rule* rule) {
    if (!rule) {
        return;
    }
    if (rule->id) {
        free((void*)rule->id);
    }
    if (rule->keyword) {
        free((void*)rule->keyword);
    }
    if (rule->name) {
        free((void*)rule->name);
    }
    if (rule->description) {
        free((void*)rule->description);
    }
    if (rule->tags) {
        Tags_delete(rule->tags);
    }
    if (rule->child_definitions) {
        ChildDefinition* scenario_definition;
        if (rule->child_definitions->child_definition_count > 0) {
            int i;
            for(i = 0; i < rule->child_definitions->child_definition_count; ++i) {
                scenario_definition = rule->child_definitions->child_definitions[i];
                if (scenario_definition->type == Gherkin_Background) {
                    Background_delete((Background*)scenario_definition);
                }
                else if (scenario_definition->type == Gherkin_Scenario) {
                    Scenario_delete((Scenario*)scenario_definition);
                }
            }
            free((void*)rule->child_definitions->child_definitions);
        }
        free((void*)rule->child_definitions);
    }
    free((void*)rule);
}